

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cLayoutBindingTests.cpp
# Opt level: O0

LayoutBindingTestResult * __thiscall
glcts::LayoutBindingBaseCase::drawTest
          (LayoutBindingTestResult *__return_storage_ptr__,LayoutBindingBaseCase *this,GLint program
          ,int binding)

{
  byte bVar1;
  int iVar2;
  deBool dVar3;
  deUint32 expected;
  undefined4 extraout_var;
  RenderContext *pRVar4;
  long lVar5;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  bool bVar6;
  String local_158;
  undefined4 local_138;
  Vector<float,_4> local_134;
  allocator<char> local_121;
  String local_120;
  String local_100;
  RGBA local_e0;
  RGBA local_dc;
  RGBA pixel;
  PrimitiveList local_b0;
  undefined1 local_92;
  allocator<char> local_91;
  string local_90;
  VertexArrayBinding *local_70;
  byte local_51;
  undefined1 local_50 [7];
  bool passed;
  Surface renderedFrame;
  GLuint viewportH;
  GLuint viewportW;
  RenderTarget *renderTarget;
  Functions *GL;
  int binding_local;
  GLint program_local;
  LayoutBindingBaseCase *this_local;
  undefined4 extraout_var_00;
  
  iVar2 = (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x16])();
  pRVar4 = deqp::Context::getRenderContext((Context *)CONCAT44(extraout_var,iVar2));
  iVar2 = (*pRVar4->_vptr_RenderContext[3])();
  lVar5 = CONCAT44(extraout_var_00,iVar2);
  iVar2 = (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x16])();
  pRVar4 = deqp::Context::getRenderContext((Context *)CONCAT44(extraout_var_01,iVar2));
  iVar2 = (*pRVar4->_vptr_RenderContext[4])();
  renderedFrame.m_pixels.m_cap._4_4_ =
       tcu::RenderTarget::getWidth((RenderTarget *)CONCAT44(extraout_var_02,iVar2));
  renderedFrame.m_pixels.m_cap._0_4_ =
       tcu::RenderTarget::getHeight((RenderTarget *)CONCAT44(extraout_var_02,iVar2));
  tcu::Surface::Surface
            ((Surface *)local_50,renderedFrame.m_pixels.m_cap._4_4_,
             (int)renderedFrame.m_pixels.m_cap);
  local_51 = 1;
  do {
    dVar3 = ::deGetFalse();
    bVar6 = false;
    if (dVar3 == 0) {
      iVar2 = (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x14])();
      bVar6 = iVar2 != 2;
    }
    if (!bVar6) {
      deAssertFail("getStage() != ComputeShader",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cLayoutBindingTests.cpp"
                   ,0x4e9);
    }
    dVar3 = ::deGetFalse();
  } while (dVar3 != 0);
  (**(code **)(lVar5 + 0x1a00))
            (0,0,renderedFrame.m_pixels.m_cap._4_4_,(int)renderedFrame.m_pixels.m_cap);
  (**(code **)(lVar5 + 0x1c0))(0,0,0,0x3f800000);
  (**(code **)(lVar5 + 0x188))(0x4000);
  (**(code **)(lVar5 + 0x1680))(program);
  (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x23])
            (this,(ulong)(uint)binding);
  if ((drawTest(int,int)::vertexArrays == '\0') &&
     (iVar2 = __cxa_guard_acquire(&drawTest(int,int)::vertexArrays), iVar2 != 0)) {
    local_92 = 1;
    local_70 = drawTest::vertexArrays;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,"inPosition",&local_91);
    glu::va::Float(drawTest::vertexArrays,&local_90,2,4,0,drawTest::position);
    local_92 = 0;
    std::__cxx11::string::~string((string *)&local_90);
    std::allocator<char>::~allocator(&local_91);
    __cxa_atexit(__cxx_global_array_dtor,0,&__dso_handle);
    __cxa_guard_release(&drawTest(int,int)::vertexArrays);
  }
  iVar2 = (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x16])();
  pRVar4 = deqp::Context::getRenderContext((Context *)CONCAT44(extraout_var_03,iVar2));
  glu::pr::TriangleStrip(&local_b0,6,drawTest::quadIndices);
  glu::draw(pRVar4,program,1,drawTest::vertexArrays,&local_b0,(DrawUtilCallback *)0x0);
  iVar2 = (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x16])();
  pRVar4 = deqp::Context::getRenderContext((Context *)CONCAT44(extraout_var_04,iVar2));
  tcu::Surface::getAccess((PixelBufferAccess *)&stack0xffffffffffffff28,(Surface *)local_50);
  glu::readPixels(pRVar4,0,0,(PixelBufferAccess *)&stack0xffffffffffffff28);
  local_dc = tcu::Surface::getPixel((Surface *)local_50,0,0);
  tcu::RGBA::RGBA(&local_e0,&this->m_expectedColor);
  local_51 = tcu::RGBA::operator==(&local_dc,&local_e0);
  (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x24])
            (this,(ulong)(uint)binding);
  bVar1 = local_51;
  if ((local_51 & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_120,"drawTest failed",&local_121);
    tcu::Vector<float,_4>::Vector(&local_134,&this->m_expectedColor);
    expected = tcu::RGBA::getPacked(&local_dc);
    generateLog<tcu::Vector<float,4>,unsigned_int>(&local_100,this,&local_120,&local_134,expected);
    LayoutBindingTestResult::LayoutBindingTestResult
              (__return_storage_ptr__,(bool)(bVar1 & 1),&local_100,false);
    std::__cxx11::string::~string((string *)&local_100);
    std::__cxx11::string::~string((string *)&local_120);
    std::allocator<char>::~allocator(&local_121);
  }
  else {
    std::__cxx11::string::string((string *)&local_158);
    LayoutBindingTestResult::LayoutBindingTestResult(__return_storage_ptr__,true,&local_158,false);
    std::__cxx11::string::~string((string *)&local_158);
  }
  local_138 = 1;
  tcu::Surface::~Surface((Surface *)local_50);
  return __return_storage_ptr__;
}

Assistant:

LayoutBindingTestResult LayoutBindingBaseCase::drawTest(glw::GLint program, int binding)
{
	const glw::Functions&	GL			  = getContext().getRenderContext().getFunctions();
	const tcu::RenderTarget& renderTarget = getContext().getRenderContext().getRenderTarget();
	glw::GLuint				 viewportW	= renderTarget.getWidth();
	glw::GLuint				 viewportH	= renderTarget.getHeight();
	tcu::Surface			 renderedFrame(viewportW, viewportH);
	bool					 passed = true;

	DE_TEST_ASSERT(getStage() != ComputeShader);

	GL.viewport(0, 0, viewportW, viewportH);
	GL.clearColor(0.0f, 0.0f, 0.0f, 1.0f);
	GL.clear(GL_COLOR_BUFFER_BIT);

	static const float position[] = {
		-1.0f, -1.0f, -1.0f, +1.0f, +1.0f, -1.0f, +1.0f, +1.0f,
	};
	static const deUint16 quadIndices[] = { 0, 1, 2, 2, 1, 3 };

	GL.useProgram(program);

	bind(binding);

	static const glu::VertexArrayBinding vertexArrays[] = {
		glu::va::Float("inPosition", 2, 4, 0, &position[0]),
	};
	glu::draw(getContext().getRenderContext(), program, DE_LENGTH_OF_ARRAY(vertexArrays), &vertexArrays[0],
			  glu::pr::TriangleStrip(DE_LENGTH_OF_ARRAY(quadIndices), &quadIndices[0]));

	glu::readPixels(getContext().getRenderContext(), 0, 0, renderedFrame.getAccess());

	tcu::RGBA pixel = renderedFrame.getPixel(0, 0);

	passed = (pixel == tcu::RGBA(m_expectedColor));

	unbind(binding);

	if (!passed)
	{
		return LayoutBindingTestResult(passed,
									   generateLog(String("drawTest failed"), m_expectedColor, pixel.getPacked()));
	}

	return true;
}